

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Buffer.cxx
# Opt level: O3

int __thiscall Fl_Text_Buffer::skip_lines(Fl_Text_Buffer *this,int startPos,int nLines)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  char *pcVar5;
  bool bVar6;
  
  if (nLines != 0) {
    iVar1 = this->mGapStart;
    iVar4 = 0;
    iVar3 = startPos;
    if (startPos < iVar1) {
      pcVar5 = this->mBuf + startPos;
      iVar4 = 0;
      iVar2 = startPos + 1;
      do {
        if ((*pcVar5 == '\n') && (iVar4 = iVar4 + 1, iVar4 == nLines)) {
          return iVar2;
        }
        pcVar5 = pcVar5 + 1;
        bVar6 = iVar2 != iVar1;
        iVar2 = iVar2 + 1;
        iVar3 = iVar1;
      } while (bVar6);
    }
    iVar2 = this->mLength;
    startPos = iVar3;
    if (iVar3 < iVar2) {
      pcVar5 = this->mBuf + (long)(this->mGapEnd - iVar1) + (long)iVar3;
      do {
        iVar3 = iVar3 + 1;
        if ((*pcVar5 == '\n') && (iVar4 = iVar4 + 1, nLines <= iVar4)) {
          return iVar3;
        }
        pcVar5 = pcVar5 + 1;
        startPos = iVar2;
      } while (iVar3 != iVar2);
    }
  }
  return startPos;
}

Assistant:

int Fl_Text_Buffer::skip_lines(int startPos, int nLines)
{
  IS_UTF8_ALIGNED2(this, (startPos))
  
  if (nLines == 0)
    return startPos;
  
  int gapLen = mGapEnd - mGapStart;
  int pos = startPos;
  int lineCount = 0;
  while (pos < mGapStart) {
    if (mBuf[pos++] == '\n') {
      lineCount++;
      if (lineCount == nLines) {
        IS_UTF8_ALIGNED2(this, (pos))
	return pos;
      }
    }
  }
  while (pos < mLength) {
    if (mBuf[pos++ + gapLen] == '\n') {
      lineCount++;
      if (lineCount >= nLines) {
        IS_UTF8_ALIGNED2(this, (pos))
	return pos;
      }
    }
  }
  IS_UTF8_ALIGNED2(this, (pos))
  return pos;
}